

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O2

double __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::gted
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,int t1_current_subtree,TreeIndexAPTED *t2,int t2_current_subtree
          )

{
  uint uVar1;
  int iVar2;
  pointer pvVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  int *piVar7;
  uint uVar8;
  TreeIndexAPTED *pTVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  
  iVar5 = (t1->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[t1_current_subtree];
  iVar12 = (t2->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[t2_current_subtree];
  if (iVar12 == 1 || iVar5 == 1) {
    dVar15 = spf1(this,t1,t1_current_subtree,t2,t2_current_subtree);
    return dVar15;
  }
  pdVar6 = data_structures::Matrix<double>::read_at
                     (&this->delta_,(long)t1_current_subtree,(long)t2_current_subtree);
  iVar4 = (int)*pdVar6;
  iVar2 = -iVar4;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  iVar11 = iVar2 + -1;
  uVar1 = (t1->super_Constants).tree_size_;
  if ((int)uVar1 < iVar2) {
    iVar5 = 0;
    if (-1 < iVar4) {
      uVar8 = 0;
      if ((int)uVar1 < iVar4) {
        uVar8 = uVar1;
      }
      iVar5 = ((uVar8 - iVar4) + iVar12 + t2_current_subtree != 0) + 1;
    }
    piVar7 = (t2->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start + (int)(iVar11 - uVar1);
    iVar12 = iVar11 - uVar1;
    while (iVar4 = *piVar7, t2_current_subtree <= iVar4) {
      pvVar3 = (t2->super_PreLToChildren).prel_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (ulong)((long)*(pointer *)
                              ((long)&pvVar3[iVar4].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl + 8) -
                      *(long *)&pvVar3[iVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl)
               >> 2;
      uVar14 = uVar13 & 0xffffffff;
      if ((int)uVar13 < 1) {
        uVar14 = 0;
      }
      for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
        iVar11 = *(int *)(*(long *)&pvVar3[iVar4].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl + uVar13 * 4);
        if (iVar11 != iVar12) {
          gted(this,t1,t1_current_subtree,t2,iVar11);
        }
      }
      iVar12 = iVar4;
      piVar7 = (t2->super_PreLToParent).prel_to_parent_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + iVar4;
    }
    if (iVar5 == 1) {
      bVar10 = true;
      pTVar9 = t1;
      iVar5 = t2_current_subtree;
LAB_00107036:
      dVar15 = spfR(this,t2,iVar5,pTVar9,t1_current_subtree,bVar10);
      return dVar15;
    }
    if (iVar5 != 0) {
      iVar11 = iVar2 + ~uVar1;
      bVar10 = true;
      pTVar9 = t1;
      iVar12 = t2_current_subtree;
LAB_00107072:
      dVar15 = spfA(this,t2,iVar12,pTVar9,t1_current_subtree,iVar11,iVar5,bVar10);
      return dVar15;
    }
    bVar10 = true;
    pTVar9 = t1;
    iVar5 = t2_current_subtree;
  }
  else {
    iVar5 = (iVar5 + t1_current_subtree != iVar4) + 1;
    if (iVar4 < 0) {
      iVar5 = 0;
    }
    piVar7 = (t1->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start + iVar11;
    iVar12 = iVar11;
    while (iVar2 = *piVar7, t1_current_subtree <= iVar2) {
      pvVar3 = (t1->super_PreLToChildren).prel_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (ulong)((long)*(pointer *)
                              ((long)&pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl + 8) -
                      *(long *)&pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl)
               >> 2;
      uVar14 = uVar13 & 0xffffffff;
      if ((int)uVar13 < 1) {
        uVar14 = 0;
      }
      for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
        iVar4 = *(int *)(*(long *)&pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + uVar13 * 4);
        if (iVar4 != iVar12) {
          gted(this,t1,iVar4,t2,t2_current_subtree);
        }
      }
      iVar12 = iVar2;
      piVar7 = (t1->super_PreLToParent).prel_to_parent_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + iVar2;
    }
    if (iVar5 == 1) {
      bVar10 = false;
      pTVar9 = t2;
      t2 = t1;
      iVar5 = t1_current_subtree;
      t1_current_subtree = t2_current_subtree;
      goto LAB_00107036;
    }
    if (iVar5 != 0) {
      bVar10 = false;
      pTVar9 = t2;
      t2 = t1;
      iVar12 = t1_current_subtree;
      t1_current_subtree = t2_current_subtree;
      goto LAB_00107072;
    }
    bVar10 = false;
    pTVar9 = t2;
    t2 = t1;
    iVar5 = t1_current_subtree;
    t1_current_subtree = t2_current_subtree;
  }
  dVar15 = spfL(this,t2,iVar5,pTVar9,t1_current_subtree,bVar10);
  return dVar15;
}

Assistant:

double APTEDTreeIndex<CostModel, TreeIndex>::gted(const TreeIndex& t1,
    int t1_current_subtree, const TreeIndex& t2,
    int t2_current_subtree) {
  const int currentSubtree1 = t1_current_subtree;
  const int currentSubtree2 = t2_current_subtree;
  const int subtreeSize1 = t1.prel_to_size_[currentSubtree1];
  const int subtreeSize2 = t2.prel_to_size_[currentSubtree2];

  // std::cout << "gted(" << currentSubtree1 << "," << currentSubtree2 << ")" << std::endl;

  double result = 0;

  // Use spf1.
  if ((subtreeSize1 == 1 || subtreeSize2 == 1)) {
    result = spf1(t1, currentSubtree1, t2, currentSubtree2);
    // std::cerr << "spf1(" << currentSubtree1 << "," << currentSubtree2 << ") = " << result << std::endl;
    return result;
  }

  int strategyPathID = static_cast<int>(delta_.read_at(currentSubtree1, currentSubtree2));

  int strategyPathType = -1;
  int currentPathNode = std::abs(strategyPathID) - 1;
  int pathIDOffset = t1.tree_size_;

  int parent = -1;
  if(currentPathNode < pathIDOffset) {
    strategyPathType = get_strategy_path_type(strategyPathID, pathIDOffset, currentSubtree1, subtreeSize1);
    parent = t1.prel_to_parent_[currentPathNode];
    while(parent >= currentSubtree1) {
      auto& ai = t1.prel_to_children_[parent];
      int k = ai.size();
      for(int i = 0; i < k; ++i) {
        int child = ai[i];
        if(child != currentPathNode) {
          // t1.set_current_node(child);
          gted(t1, child, t2, t2_current_subtree);
        }
      }
      currentPathNode = parent;
      parent = t1.prel_to_parent_[currentPathNode];
    }
    // TODO: Move this property away from node indexer and pass directly to spfs.
    // t1.set_current_node(currentSubtree1);

    // Pass to spfs a boolean that says says if the order of input subtrees
    // has been swapped compared to the order of the initial input trees.
    // Used for accessing delta array and deciding on the edit operation
    // [1, Section 3.4].
    if (strategyPathType == 0) {
      result = spfL(t1, t1_current_subtree, t2, t2_current_subtree, false);
      // std::cerr << "spfL(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
      return result;
    }
    if (strategyPathType == 1) {
      result = spfR(t1, t1_current_subtree, t2, t2_current_subtree, false);
      // std::cerr << "spfR(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
      return result;
    }
    result = spfA(t1, t1_current_subtree, t2, t2_current_subtree,
        std::abs(strategyPathID) - 1, strategyPathType, false);
    // std::cerr << "spfA(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }

  currentPathNode -= pathIDOffset;
  strategyPathType = get_strategy_path_type(strategyPathID, pathIDOffset, currentSubtree2, subtreeSize2);
  parent = t2.prel_to_parent_[currentPathNode];
  while(parent >= currentSubtree2) {
    // std::cerr << "parent = " << parent << std::endl;
    // std::cerr << "# parent's children = " << t2.prel_to_children_[parent].size() << std::endl;
    auto& ai1 = t2.prel_to_children_[parent];
    int l = ai1.size();
    for(int j = 0; j < l; ++j) {
      int child = ai1[j];
      if(child != currentPathNode) {
        // t2.set_current_node(child);
        gted(t1, t1_current_subtree, t2, child);
      }
    }
    currentPathNode = parent;
    parent = t2.prel_to_parent_[currentPathNode];
  }
  // TODO: Move this property away from node indexer and pass directly to spfs.
  // t2.set_current_node(currentSubtree2);

  // Pass to spfs a boolean that says says if the order of input subtrees
  // has been swapped compared to the order of the initial input trees. Used
  // for accessing delta array and deciding on the edit operation
  // [1, Section 3.4].
  if (strategyPathType == 0) {
    result = spfL(t2, t2_current_subtree, t1, t1_current_subtree, true);
    // std::cerr << "spfL(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }
  if (strategyPathType == 1) {
    result = spfR(t2, t2_current_subtree, t1, t1_current_subtree, true);
    // std::cerr << "spfR(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }
  result = spfA(t2, t2_current_subtree, t1, t1_current_subtree,
      std::abs(strategyPathID) - pathIDOffset - 1, strategyPathType, true);
  // std::cerr << "spfA(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
  return result;
}